

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::TPZSkylMatrix
          (TPZSkylMatrix<std::complex<long_double>_> *this,void **vtt)

{
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[3];
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[2];
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)*vtt;
  (this->fElem)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01855478;
  (this->fElem).fStore = (complex<long_double> **)0x0;
  (this->fElem).fNElements = 0;
  (this->fElem).fNAlloc = 0;
  (this->fStorage)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181e7c0;
  (this->fStorage).fStore = (complex<long_double> *)0x0;
  (this->fStorage).fNElements = 0;
  (this->fStorage).fNAlloc = 0;
  return;
}

Assistant:

TPZSavable() : TPZRegisterClassId(&TPZSavable::ClassId) { }